

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_removeImportedComponentByReference_Test::Model_removeImportedComponentByReference_Test
          (Model_removeImportedComponentByReference_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00134d50;
  return;
}

Assistant:

TEST(Model, removeImportedComponentByReference)
{
    auto model = commonSetupImportedComponent();
    auto myConcreteComponent = model->component(0);
    auto myImportedComponent = model->component(1);

    EXPECT_TRUE(model->removeComponent(myConcreteComponent));
    EXPECT_TRUE(model->removeComponent(myImportedComponent));

    EXPECT_EQ(size_t(0), model->componentCount());
}